

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

iterator __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
          (SmallVectorImpl<std::__cxx11::string> *this,iterator I,StringRef *From,StringRef *To)

{
  move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  in_end;
  undefined8 *puVar1;
  undefined8 *puVar2;
  iterator pbVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__result;
  size_t MinSize;
  long lVar10;
  ulong uVar11;
  string *this_01;
  long lVar12;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pbVar3 = *(iterator *)this;
  lVar9 = (long)I - (long)pbVar3;
  if (pbVar3 + *(uint *)(this + 8) == I) {
    append<llvm::StringRef_const*,void>(this,From,To);
    __result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (lVar9 + *(long *)this);
  }
  else {
    if (I < pbVar3) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    if (pbVar3 + *(uint *)(this + 8) < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    uVar8 = (long)To - (long)From >> 4;
    MinSize = *(uint *)(this + 8) + uVar8;
    if (*(uint *)(this + 0xc) < MinSize) {
      SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              *)this,MinSize);
    }
    lVar4 = *(long *)this;
    __result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar4 + lVar9);
    lVar12 = (ulong)*(uint *)(this + 8) * 0x20;
    in_end._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar4 + lVar12);
    uVar11 = lVar12 - lVar9 >> 5;
    if (uVar11 < uVar8) {
      uVar8 = uVar8 + *(uint *)(this + 8);
      if (*(uint *)(this + 0xc) < uVar8) {
        __assert_fail("Size <= capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
      }
      *(int *)(this + 8) = (int)uVar8;
      if (lVar12 != lVar9) {
        lVar7 = (uVar8 & 0xffffffff) * 0x20 + uVar11 * -0x20 + lVar4;
        lVar4 = lVar4 + lVar9;
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)(lVar7 + 0x10 + lVar10);
          puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar10);
          *(undefined8 **)(lVar7 + lVar10) = puVar1;
          if (puVar2 == *(undefined8 **)(lVar4 + lVar10)) {
            uVar6 = puVar2[1];
            *puVar1 = *puVar2;
            puVar1[1] = uVar6;
          }
          else {
            puVar1[-2] = *(undefined8 **)(lVar4 + lVar10);
            *puVar1 = *puVar2;
          }
          *(undefined8 *)(lVar7 + 8 + lVar10) = *(undefined8 *)(lVar4 + 8 + lVar10);
          *(undefined8 **)(lVar4 + lVar10) = puVar2;
          *(undefined8 *)(lVar4 + 8 + lVar10) = 0;
          *(undefined1 *)(lVar4 + 0x10 + lVar10) = 0;
          lVar10 = lVar10 + 0x20;
        } while (lVar12 - lVar9 != lVar10);
      }
      if (lVar12 != lVar9) {
        this_00 = __result;
        do {
          pcVar5 = From->Data;
          local_50 = &local_40;
          if (pcVar5 == (char *)0x0) {
            local_48 = 0;
            local_40 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,pcVar5,pcVar5 + From->Length);
          }
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
          this_00 = this_00 + 1;
          From = From + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      std::__uninitialized_copy<false>::__uninit_copy<llvm::StringRef_const*,std::__cxx11::string*>
                (From,To,in_end._M_current);
    }
    else {
      append<std::move_iterator<std::__cxx11::string*>,void>(this,in_end._M_current + -uVar8,in_end)
      ;
      lVar9 = (long)(in_end._M_current + -uVar8) - (long)__result >> 5;
      if (0 < lVar9) {
        lVar9 = lVar9 + 1;
        this_01 = (string *)(lVar12 + lVar4);
        do {
          this_01 = this_01 + -0x20;
          std::__cxx11::string::operator=(this_01,this_01 + uVar8 * -0x20);
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<llvm::StringRef_const*,std::__cxx11::string*>(From,To,__result);
    }
  }
  return __result;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }